

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TiledInputFile::multiPartInitialize(TiledInputFile *this,InputPartData *part)

{
  Data *pDVar1;
  bool bVar2;
  int iVar3;
  string *__lhs;
  undefined4 extraout_var;
  ArgExc *this_00;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> _Stack_38;
  
  __lhs = Header::type_abi_cxx11_(&part->header);
  bVar2 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )TILEDIMAGE_abi_cxx11_);
  if (!bVar2) {
    pDVar1 = this->_data;
    pDVar1->_streamData = part->mutex;
    Header::operator=(&pDVar1->header,&part->header);
    pDVar1 = this->_data;
    pDVar1->version = part->version;
    pDVar1->partNumber = part->partNumber;
    iVar3 = (*pDVar1->_streamData->is->_vptr_IStream[2])();
    this->_data->memoryMapped = SUB41(iVar3,0);
    initialize(this);
    pDVar1 = this->_data;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_38,
               &part->chunkOffsets);
    TileOffsets::readFrom
              (&pDVar1->tileOffsets,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_38,
               &this->_data->fileIsComplete);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&_Stack_38);
    iVar3 = (*this->_data->_streamData->is->_vptr_IStream[5])();
    this->_data->_streamData->currentPosition = CONCAT44(extraout_var,iVar3);
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,"Can\'t build a TiledInputFile from a type-mismatched part.");
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
TiledInputFile::multiPartInitialize(InputPartData* part)
{
    if (part->header.type() != TILEDIMAGE)
        throw IEX_NAMESPACE::ArgExc("Can't build a TiledInputFile from a type-mismatched part.");

    _data->_streamData = part->mutex;
    _data->header = part->header;
    _data->version = part->version;
    _data->partNumber = part->partNumber;
    _data->memoryMapped = _data->_streamData->is->isMemoryMapped();
    initialize();
    _data->tileOffsets.readFrom(part->chunkOffsets,_data->fileIsComplete);
    _data->_streamData->currentPosition = _data->_streamData->is->tellg();
}